

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureArrayPrototypeEntriesFunction(JavascriptLibrary *this)

{
  Type *this_00;
  bool bVar1;
  RuntimeFunction *ptr;
  
  this_00 = &(this->super_JavascriptLibraryBase).arrayPrototypeEntriesFunction;
  if ((this->super_JavascriptLibraryBase).arrayPrototypeEntriesFunction.ptr ==
      (JavascriptFunction *)0x0) {
    bVar1 = ScriptContext::IsJsBuiltInEnabled((this->super_JavascriptLibraryBase).scriptContext.ptr)
    ;
    if (bVar1) {
      EnsureBuiltInEngineIsReady
                (Array_prototype,(this->super_JavascriptLibraryBase).scriptContext.ptr);
    }
    else {
      ptr = DefaultCreateFunction
                      (this,(FunctionInfo *)JavascriptArray::EntryInfo::Entries,0,
                       (DynamicObject *)0x0,(DynamicType *)0x0,0x7a);
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
                (this_00,&ptr->super_JavascriptFunction);
    }
  }
  return this_00->ptr;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureArrayPrototypeEntriesFunction()
    {
        if (arrayPrototypeEntriesFunction == nullptr)
        {
#ifndef ENABLE_JS_BUILTINS
            arrayPrototypeEntriesFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Entries, 0, nullptr, nullptr, PropertyIds::entries);
#else
            if (!scriptContext->IsJsBuiltInEnabled())
            {
                arrayPrototypeEntriesFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Entries, 0, nullptr, nullptr, PropertyIds::entries);
            }
            else
            {
                EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
            }
#endif
        }
        return arrayPrototypeEntriesFunction;
    }